

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrokeTests.cpp
# Opt level: O3

void __thiscall
agge::tests::PathStrokeTests::StrokerGeneratesSinglePointSequenceForOpenSegment
          (PathStrokeTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  cap *pcVar3;
  join *pjVar4;
  FailedAssertion *pFVar5;
  long lVar6;
  size_t sVar7;
  stroke s;
  undefined1 local_278 [8];
  undefined4 local_270;
  undefined8 local_26c;
  undefined4 local_264;
  undefined8 local_260;
  undefined4 local_258;
  undefined8 local_254;
  undefined4 local_24c;
  undefined8 local_248;
  undefined4 local_240;
  undefined8 local_23c;
  undefined4 local_234;
  undefined8 local_230;
  undefined4 local_228;
  undefined8 local_224;
  undefined4 local_21c;
  point local_218;
  undefined8 local_20c;
  undefined4 local_204;
  undefined8 local_200;
  undefined4 local_1f8;
  undefined8 local_1f4;
  undefined4 local_1ec;
  undefined8 local_1e8;
  undefined4 local_1e0;
  undefined8 local_1dc;
  undefined4 local_1d4;
  undefined8 local_1d0;
  undefined4 local_1c8;
  undefined8 local_1c4;
  undefined4 local_1bc;
  stroke local_1b8;
  LocationInfo local_160;
  undefined1 local_138 [44];
  int local_10c;
  pointer local_108;
  int local_100;
  pointer local_fc;
  int local_f4;
  pointer local_f0;
  int local_e8;
  pointer local_e4;
  int local_dc;
  point local_d8;
  real_t local_cc;
  real_t rStack_c8;
  int local_c4;
  point local_c0;
  point local_b4;
  point local_a8;
  point local_9c;
  point local_90;
  point local_84;
  string local_70;
  string local_50;
  
  stroke::stroke(&local_1b8);
  stroke::add_vertex(&local_1b8,0.0,0.0,1);
  stroke::add_vertex(&local_1b8,0.0,1.0,2);
  sVar7 = this->amount_alive;
  this->amount_alive = sVar7 + 1;
  pcVar3 = (cap *)operator_new(0x10);
  pcVar3[1]._vptr_cap = (_func_int **)this;
  sVar7 = sVar7 + 2;
  this->amount_alive = sVar7;
  pcVar3->_vptr_cap = (_func_int **)&PTR__counted_001c30e8;
  if (local_1b8._cap != (cap *)0x0) {
    (*(local_1b8._cap)->_vptr_cap[1])();
    sVar7 = this->amount_alive;
  }
  local_1b8._cap = pcVar3;
  pjVar4 = (join *)operator_new(0x10);
  pjVar4[1]._vptr_join = (_func_int **)this;
  this->amount_alive = sVar7 + 1;
  pjVar4->_vptr_join = (_func_int **)&PTR__counted_001c3138;
  if (local_1b8._join != (join *)0x0) {
    (*(local_1b8._join)->_vptr_join[1])();
    sVar7 = this->amount_alive - 1;
  }
  this->amount_alive = sVar7;
  local_1b8._join = pjVar4;
  stroke::width(&local_1b8,4.0);
  local_218.command = 0;
  local_218.x = 0.0;
  local_218.y = 0.0;
  local_d8.command = stroke::vertex(&local_1b8,&local_218.x,&local_218.y);
  local_d8.x = local_218.x;
  local_d8.y = local_218.y;
  local_218.command = 0;
  local_218.x = 0.0;
  local_218.y = 0.0;
  local_c4 = stroke::vertex(&local_1b8,&local_218.x,&local_218.y);
  local_cc = local_218.x;
  rStack_c8 = local_218.y;
  local_218.command = 0;
  local_218.x = 0.0;
  local_218.y = 0.0;
  local_c0.command = stroke::vertex(&local_1b8,&local_218.x,&local_218.y);
  local_c0.x = local_218.x;
  local_c0.y = local_218.y;
  local_218.command = 0;
  local_218.x = 0.0;
  local_218.y = 0.0;
  local_b4.command = stroke::vertex(&local_1b8,&local_218.x,&local_218.y);
  local_b4.x = local_218.x;
  local_b4.y = local_218.y;
  local_218.command = 0;
  local_218.x = 0.0;
  local_218.y = 0.0;
  local_a8.command = stroke::vertex(&local_1b8,&local_218.x,&local_218.y);
  local_a8.x = local_218.x;
  local_a8.y = local_218.y;
  local_218.command = 0;
  local_218.x = 0.0;
  local_218.y = 0.0;
  local_9c.command = stroke::vertex(&local_1b8,&local_218.x,&local_218.y);
  local_9c.x = local_218.x;
  local_9c.y = local_218.y;
  local_218.command = 0;
  local_218.x = 0.0;
  local_218.y = 0.0;
  local_90.command = stroke::vertex(&local_1b8,&local_218.x,&local_218.y);
  local_90.x = local_218.x;
  local_90.y = local_218.y;
  local_218.command = 0;
  local_218.x = 0.0;
  local_218.y = 0.0;
  local_84.command = stroke::vertex(&local_1b8,&local_218.x,&local_218.y);
  local_84.x = local_218.x;
  local_84.y = local_218.y;
  local_218.x = 2.0;
  local_218.y = 1.0;
  local_218.command = 1;
  local_20c = 0;
  local_204 = 2;
  local_200 = 0x3f80000000000000;
  local_1f8 = 2;
  local_1f4 = 0x3f80000040000000;
  local_1ec = 2;
  local_1e8 = 0x3f80000000000000;
  local_1e0 = 2;
  local_1dc = 0;
  local_1d4 = 2;
  local_1d0 = 0;
  local_1c8 = 0x30;
  local_1c4 = 0;
  local_1bc = 0;
  paVar1 = &local_160.filename.field_2;
  local_160.filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_160,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_138,&local_160.filename,0xf3);
  lVar6 = 0;
  do {
    bVar2 = mocks::path::point::operator==
                      ((point *)((long)&local_218.x + lVar6),(point *)((long)&local_d8.x + lVar6));
    if (!bVar2) {
      pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_278 = (undefined1  [8])((long)&local_26c + 4);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_278,"Value is not \'true\'!","");
      ut::FailedAssertion::FailedAssertion(pFVar5,(string *)local_278,(LocationInfo *)local_138);
      __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    lVar6 = lVar6 + 0xc;
  } while (lVar6 != 0x60);
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_160.filename._M_dataplus._M_p);
  }
  stroke::remove_all(&local_1b8);
  stroke::width(&local_1b8,3.0);
  stroke::add_vertex(&local_1b8,1.0,2.0,1);
  stroke::add_vertex(&local_1b8,4.0,6.0,2);
  local_270 = 0;
  local_278 = (undefined1  [8])0x0;
  local_138._8_4_ = stroke::vertex(&local_1b8,(real_t *)local_278,(real_t *)(local_278 + 4));
  local_138._0_8_ = local_278;
  local_270 = 0;
  local_278 = (undefined1  [8])0x0;
  local_138._20_4_ = stroke::vertex(&local_1b8,(real_t *)local_278,(real_t *)(local_278 + 4));
  local_138._12_8_ = local_278;
  local_270 = 0;
  local_278 = (undefined1  [8])0x0;
  local_138._32_4_ = stroke::vertex(&local_1b8,(real_t *)local_278,(real_t *)(local_278 + 4));
  local_138._24_8_ = local_278;
  local_270 = 0;
  local_278 = (undefined1  [8])0x0;
  local_10c = stroke::vertex(&local_1b8,(real_t *)local_278,(real_t *)(local_278 + 4));
  local_138._36_8_ = local_278;
  local_270 = 0;
  local_278 = (undefined1  [8])0x0;
  local_100 = stroke::vertex(&local_1b8,(real_t *)local_278,(real_t *)(local_278 + 4));
  local_108 = (pointer)local_278;
  local_270 = 0;
  local_278 = (undefined1  [8])0x0;
  local_f4 = stroke::vertex(&local_1b8,(real_t *)local_278,(real_t *)(local_278 + 4));
  local_fc = (pointer)local_278;
  local_270 = 0;
  local_278 = (undefined1  [8])0x0;
  local_e8 = stroke::vertex(&local_1b8,(real_t *)local_278,(real_t *)(local_278 + 4));
  local_f0 = (pointer)local_278;
  local_270 = 0;
  local_278 = (undefined1  [8])0x0;
  local_dc = stroke::vertex(&local_1b8,(real_t *)local_278,(real_t *)(local_278 + 4));
  local_e4 = (pointer)local_278;
  local_278 = (undefined1  [8])0x40a000003fc00000;
  local_270 = 1;
  local_26c = 0x400000003f800000;
  local_264 = 2;
  local_260 = 0x40c0000040800000;
  local_258 = 2;
  local_254 = 0x40a000003fc00000;
  local_24c = 2;
  local_248 = 0x40c0000040800000;
  local_240 = 2;
  local_23c = 0x400000003f800000;
  local_234 = 2;
  local_230 = 0;
  local_228 = 0x30;
  local_224 = 0;
  local_21c = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_160,&local_70,0x106);
  lVar6 = 0;
  do {
    bVar2 = mocks::path::point::operator==
                      ((point *)(local_278 + lVar6),(point *)(local_138 + lVar6));
    if (!bVar2) {
      pFVar5 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Value is not \'true\'!","");
      ut::FailedAssertion::FailedAssertion(pFVar5,&local_50,&local_160);
      __cxa_throw(pFVar5,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    lVar6 = lVar6 + 0xc;
  } while (lVar6 != 0x60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_160.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  stroke::~stroke(&local_1b8);
  return;
}

Assistant:

test( StrokerGeneratesSinglePointSequenceForOpenSegment )
			{
				// INIT
				stroke s;

				move_to(s, 0.0f, 0.0f);
				line_to(s, 0.0f, 1.0f);

				s.set_cap(passthrough_cap(amount_alive));
				s.set_join(passthrough_join(amount_alive));
				s.width(4.0f);

				// ACT
				mocks::path::point points1[] = { vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), };

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(2.0f, 1.0f), lineto(0.0f, 0.0f), lineto(0.0f, 1.0f),
					lineto(2.0f, 1.0f), lineto(0.0f, 1.0f), lineto(0.0f, 0.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, points1);

				// INIT
				s.remove_all();
				s.width(3.0f);
				move_to(s, 1.0f, 2.0f);
				line_to(s, 4.0f, 6.0f);

				// ACT
				mocks::path::point points2[] = { vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), };

				// ASSERT
				mocks::path::point reference2[] = {
					moveto(1.5f, 5.0f), lineto(1.0f, 2.0f), lineto(4.0f, 6.0f),
					lineto(1.5f, 5.0f), lineto(4.0f, 6.0f), lineto(1.0f, 2.0f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, points2);
			}